

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.hpp
# Opt level: O3

void msgpack::v3::unpack(object_handle *result,char *data,size_t len,size_t *off,bool *referenced,
                        unpack_reference_func f,void *user_data,unpack_limit *limit)

{
  zone *__ptr;
  parse_return pVar1;
  zone *pzVar2;
  zone *local_e0 [2];
  undefined8 uStack_d0;
  undefined4 local_c8;
  size_t *local_b8;
  create_object_visitor local_b0;
  
  local_b8 = off;
  pzVar2 = (zone *)v1::zone::operator_new((zone *)0x38,(size_t)data);
  pzVar2->m_chunk_size = 0x2000;
  v1::zone::chunk_list::chunk_list(&pzVar2->m_chunk_list,0x2000);
  (pzVar2->m_finalizer_array).m_tail = (finalizer *)0x0;
  (pzVar2->m_finalizer_array).m_end = (finalizer *)0x0;
  (pzVar2->m_finalizer_array).m_array = (finalizer *)0x0;
  *referenced = false;
  local_e0[0] = pzVar2;
  v2::detail::create_object_visitor::create_object_visitor(&local_b0,f,user_data,limit);
  *referenced = false;
  local_b0.m_referenced = false;
  local_b0.m_zone = pzVar2;
  pVar1 = v2::detail::parse_imp<msgpack::v2::detail::create_object_visitor>
                    (data,len,local_b8,&local_b0);
  *referenced = local_b0.m_referenced;
  local_e0[1] = (zone *)local_b0.m_obj.super_object._4_8_;
  uStack_d0 = local_b0.m_obj.super_object.via._4_8_;
  local_c8 = local_b0.m_obj.super_object.via._12_4_;
  if (local_b0.m_stack.
      super__Vector_base<msgpack::v2::object_*,_std::allocator<msgpack::v2::object_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.m_stack.
                    super__Vector_base<msgpack::v2::object_*,_std::allocator<msgpack::v2::object_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  pzVar2 = local_e0[0];
  if ((pVar1 == PARSE_EXTRA_BYTES) || (pVar1 == PARSE_SUCCESS)) {
    (result->m_obj).super_object.type = local_b0.m_obj.super_object.type;
    *(zone **)&(result->m_obj).super_object.field_0x4 = local_e0[1];
    *(undefined8 *)((long)&(result->m_obj).super_object.via + 4) = uStack_d0;
    *(undefined4 *)((long)&(result->m_obj).super_object.via + 0xc) = local_c8;
    local_e0[0] = (zone *)0x0;
    __ptr = (result->m_zone)._M_t.
            super___uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>._M_t.
            super__Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>.
            super__Head_base<0UL,_msgpack::v1::zone_*,_false>._M_head_impl;
    (result->m_zone)._M_t.
    super___uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>._M_t.
    super__Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>.
    super__Head_base<0UL,_msgpack::v1::zone_*,_false>._M_head_impl = pzVar2;
    if (__ptr == (zone *)0x0) {
      return;
    }
    std::default_delete<msgpack::v1::zone>::operator()
              ((default_delete<msgpack::v1::zone> *)&result->m_zone,__ptr);
  }
  if (local_e0[0] != (zone *)0x0) {
    std::default_delete<msgpack::v1::zone>::operator()
              ((default_delete<msgpack::v1::zone> *)local_e0,local_e0[0]);
  }
  return;
}

Assistant:

inline void unpack(
    msgpack::object_handle& result,
    const char* data, std::size_t len, std::size_t& off, bool& referenced,
    msgpack::unpack_reference_func f, void* user_data,
    msgpack::unpack_limit const& limit)
{
    msgpack::object obj;
    msgpack::unique_ptr<msgpack::zone> z(new msgpack::zone);
    referenced = false;
    parse_return ret = detail::unpack_imp(
        data, len, off, *z, obj, referenced, f, user_data, limit);

    switch(ret) {
    case PARSE_SUCCESS:
        result.set(obj);
        result.zone() = msgpack::move(z);
        return;
    case PARSE_EXTRA_BYTES:
        result.set(obj);
        result.zone() = msgpack::move(z);
        return;
    default:
        return;
    }
}